

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O0

string * namingConventions::editToNewName
                   (string *__return_storage_ptr__,string *word,string *oldName,string *correctName)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  uint local_80;
  uint pos;
  uint pos_1;
  uint local_68;
  uint c;
  uint oldname_i;
  string local_58 [3];
  bool found;
  uint functionCall;
  string newName;
  uint misses;
  uint end;
  uint start;
  uint correctCount;
  string *correctName_local;
  string *oldName_local;
  string *word_local;
  
  end = 0;
  misses = 0;
  newName.field_2._12_4_ = 0;
  newName.field_2._8_4_ = 0;
  std::__cxx11::string::string(local_58);
  oldname_i = 0;
  bVar2 = false;
  for (local_68 = 0; uVar3 = std::__cxx11::string::size(), local_68 < uVar3; local_68 = local_68 + 1
      ) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
    if (*pcVar4 == '(') {
      oldname_i = local_68;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
    cVar1 = *pcVar4;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)oldName);
    if ((cVar1 != *pcVar4) || (bVar2)) {
      end = 0;
      bVar2 = false;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
      if ((*pcVar4 != '(') &&
         ((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar4 != ')' &&
          (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar4 != ';')))) {
        newName.field_2._8_4_ = newName.field_2._8_4_ + 1;
      }
    }
    else {
      lVar5 = std::__cxx11::string::size();
      if ((ulong)end == lVar5 - 1U) {
        newName.field_2._12_4_ = local_68;
        bVar2 = true;
        if (end == 0) {
          misses = local_68;
        }
      }
      else {
        end = end + 1;
        if (end == 1) {
          misses = local_68;
        }
      }
    }
  }
  if (newName.field_2._8_4_ == 0) {
    for (local_80 = 0; local_80 != misses; local_80 = local_80 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
      std::__cxx11::string::operator+=(local_58,*pcVar4);
    }
    std::__cxx11::string::operator+=(local_58,(string *)correctName);
    local_80 = newName.field_2._12_4_;
    while( true ) {
      local_80 = local_80 + 1;
      uVar3 = std::__cxx11::string::size();
      if (uVar3 <= local_80) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
      std::__cxx11::string::operator+=(local_58,*pcVar4);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_58);
  }
  else if ((oldname_i == 0) || (!bVar2)) {
    if (oldname_i == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)word);
    }
    else {
      std::__cxx11::string::operator=(local_58,(string *)correctName);
      for (; uVar3 = std::__cxx11::string::size(), oldname_i < uVar3; oldname_i = oldname_i + 1) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
        std::__cxx11::string::operator+=(local_58,*pcVar4);
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,local_58);
    }
  }
  else {
    for (pos = 0; pos != oldname_i + 1; pos = pos + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
      std::__cxx11::string::operator+=(local_58,*pcVar4);
    }
    std::__cxx11::string::operator+=(local_58,(string *)correctName);
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_58);
  }
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string
namingConventions::editToNewName(std::string &word, const std::string &oldName, const std::string &correctName) {
    unsigned int correctCount = 0;
    unsigned int start = 0;
    unsigned int end = 0;
    unsigned int misses = 0;
    std::string newName;
    unsigned int functionCall = 0;

    bool found = false;
    unsigned int oldname_i = 0;

    // zoekt start en eindpunt van gezochte naam in stukje tekst, telt het aantal misses, etc..
    for (unsigned int c = 0; c < word.size(); ++c) {
      if(word[c] == '('){
        functionCall = c;
      }

        if (word[c] == oldName[oldname_i] && !found) {
            if (correctCount == oldName.size() - 1) {
                end = c;
                found = true;
                if(correctCount == 0){
                  start = c;
                }
            } else {
                correctCount += 1;
                oldname_i += 1;
                if (correctCount == 1) {
                    start = c;
                }
            }

        } else {
            correctCount = 0;
            found = false;
            oldname_i = 0;
            if(word[c] != '(' && word[c] != ')' && word[c] != ';' )
            misses += 1;
        }
    }

    // past de tekst aan
    if(misses > 0){
      if(functionCall != 0 && found){
        unsigned int pos = 0;
        while (pos != functionCall + 1) { //variable in function call
          newName += word[pos];
          pos += 1;
        }
        newName += correctName;
        return newName;

      }else if(functionCall != 0){  // function being called
        newName = correctName;
        while (functionCall < word.size()) {
          newName += word[functionCall];
          functionCall += 1;
        }
        return newName;
      }
      return word;
    }
    unsigned int pos = 0;
    while (pos != start) {
        newName += word[pos];
        pos += 1;
    }
    newName += correctName;
    pos = end + 1;
    while (pos < word.size()) {
        newName += word[pos];
        pos += 1;
    }
    return newName;

}